

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::StateInteractionCase::generateVarLinkVertexShaderSrc
          (StateInteractionCase *this,string *outVtxSrc,GLSLVersion glslVersion,int numOutputs)

{
  char *pcVar1;
  ostream *poVar2;
  string local_1c8 [48];
  undefined1 local_198 [8];
  ostringstream vtxSrc;
  int numOutputs_local;
  GLSLVersion glslVersion_local;
  string *outVtxSrc_local;
  StateInteractionCase *this_local;
  
  vtxSrc._368_4_ = numOutputs;
  vtxSrc._372_4_ = glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar1 = glu::getGLSLVersionDeclaration(vtxSrc._372_4_);
  poVar2 = std::operator<<((ostream *)local_198,pcVar1);
  std::operator<<(poVar2,"\n");
  if (8 < (int)vtxSrc._372_4_) {
    std::operator<<((ostream *)local_198,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n");
  }
  std::operator<<((ostream *)local_198,"in highp vec4 a_position;\n");
  std::operator<<((ostream *)local_198,"uniform highp vec4 u_color;\n");
  switch(vtxSrc._368_4_) {
  case (BADTYPE)0x5:
    std::operator<<((ostream *)local_198,"layout(location = 3) out vec4 o_val5;\n");
  case (BADTYPE)0x4:
    std::operator<<((ostream *)local_198,"flat out uvec4 val4;\n");
  case (BADTYPE)0x3:
    std::operator<<((ostream *)local_198,"flat out ivec2 val3;\n");
  case (BADTYPE)0x2:
    std::operator<<((ostream *)local_198,"out vec3 val2[2];\n");
  case (BADTYPE)0x1:
    std::operator<<((ostream *)local_198,"out vec4 val1;\n");
  default:
    std::operator<<((ostream *)local_198,"out float val0;\n");
    std::operator<<((ostream *)local_198,"void main (void)\n");
    std::operator<<((ostream *)local_198,"{\n");
    std::operator<<((ostream *)local_198,"   gl_Position = a_position;\n");
    switch(vtxSrc._368_4_) {
    case (BADTYPE)0x1:
      std::operator<<((ostream *)local_198,"    val1 = u_color;\n");
      break;
    case (BADTYPE)0x2:
      std::operator<<((ostream *)local_198,"    val2[0] = vec3(u_color);\n");
      break;
    case (BADTYPE)0x3:
      std::operator<<((ostream *)local_198,"    val3 = ivec2(u_color);\n");
      break;
    case (BADTYPE)0x4:
      std::operator<<((ostream *)local_198,"    val4 = uvec4(u_color);\n");
      break;
    case (BADTYPE)0x5:
      std::operator<<((ostream *)local_198,"    o_val5 = u_color;\n");
      break;
    default:
      std::operator<<((ostream *)local_198,"    val0 = u_color.x;\n");
    }
    std::operator<<((ostream *)local_198,"}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)outVtxSrc,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    return;
  }
}

Assistant:

void generateVarLinkVertexShaderSrc(std::string& outVtxSrc, glu::GLSLVersion glslVersion, int numOutputs)
	{
		std::ostringstream vtxSrc;

		vtxSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		if (glslVersion >= glu::GLSL_VERSION_410)
		{
			vtxSrc << "out gl_PerVertex {\n"
					  "  vec4 gl_Position;\n"
					  "};\n";
		}
		vtxSrc << "in highp vec4 a_position;\n";
		vtxSrc << "uniform highp vec4 u_color;\n";

		switch (numOutputs)
		{
		// Note all these cases fall through
		case 5:
			vtxSrc << "layout(location = 3) out vec4 o_val5;\n";
		case 4:
			vtxSrc << "flat out uvec4 val4;\n";
		case 3:
			vtxSrc << "flat out ivec2 val3;\n";
		case 2:
			vtxSrc << "out vec3 val2[2];\n";
		case 1:
			vtxSrc << "out vec4 val1;\n";
		default:
			vtxSrc << "out float val0;\n";
		}

		vtxSrc << "void main (void)\n";
		vtxSrc << "{\n";
		vtxSrc << "   gl_Position = a_position;\n";

		// The color uniform is passed in the last declared output variable
		switch (numOutputs)
		{
		case 5:
			vtxSrc << "    o_val5 = u_color;\n";
			break;
		case 4:
			vtxSrc << "    val4 = uvec4(u_color);\n";
			break;
		case 3:
			vtxSrc << "    val3 = ivec2(u_color);\n";
			break;
		case 2:
			vtxSrc << "    val2[0] = vec3(u_color);\n";
			break;
		case 1:
			vtxSrc << "    val1 = u_color;\n";
			break;
		default:
			vtxSrc << "    val0 = u_color.x;\n";
			break;
		}
		vtxSrc << "}\n";

		outVtxSrc = vtxSrc.str();
	}